

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O1

int x25519_on_exchange(ptls_key_exchange_context_t *_ctx,ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  int iVar1;
  
  if (secret == (ptls_iovec_t *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0x33;
    if (peerkey.len == 0x20) {
      iVar1 = x25519_derive_secret
                        (secret,(uint8_t *)(_ctx + 1),(uint8_t *)(_ctx + 5),(uint8_t *)0x0,
                         peerkey.base);
    }
  }
  (*ptls_clear_memory)(_ctx + 1,0x20);
  free(_ctx);
  return iVar1;
}

Assistant:

static int x25519_on_exchange(ptls_key_exchange_context_t *_ctx, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_x25519_key_exchange_t *ctx = (struct st_x25519_key_exchange_t *)_ctx;
    int ret;

    if (secret == NULL) {
        ret = 0;
        goto Exit;
    }

    if (peerkey.len != X25519_KEY_SIZE) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = x25519_derive_secret(secret, ctx->priv, ctx->pub, NULL, peerkey.base);

Exit:
    ptls_clear_memory(ctx->priv, sizeof(ctx->priv));
    free(ctx);
    return ret;
}